

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O2

Locale * icu_63::Locale::getAvailableLocales(int32_t *count)

{
  umtx_initOnce((UInitOnce *)&gInitOnceLocale,locale_available_init);
  *count = availableLocaleListCount;
  return availableLocaleList;
}

Assistant:

const Locale* U_EXPORT2
Locale::getAvailableLocales(int32_t& count)
{
    umtx_initOnce(gInitOnceLocale, &locale_available_init);
    count = availableLocaleListCount;
    return availableLocaleList;
}